

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

sxi32 jx9GetNextExpr(SyToken *pStart,SyToken *pEnd,SyToken **ppNext)

{
  uint uVar1;
  sxi32 sVar2;
  int iVar3;
  int iVar4;
  
  sVar2 = -0x12;
  if ((pStart < pEnd) && ((pStart->nType & 0x40000) == 0)) {
    for (iVar3 = 0;
        (pStart < pEnd && ((uVar1 = pStart->nType, (uVar1 & 0x60000) == 0 || (0 < iVar3))));
        iVar3 = iVar3 + iVar4) {
      iVar4 = -(uint)((uVar1 & 0x1480) != 0);
      if ((uVar1 & 0xa40) != 0) {
        iVar4 = 1;
      }
      pStart = pStart + 1;
    }
    *ppNext = pStart;
    sVar2 = 0;
  }
  return sVar2;
}

Assistant:

JX9_PRIVATE sxi32 jx9GetNextExpr(SyToken *pStart,SyToken *pEnd,SyToken **ppNext)
{
	SyToken *pCur = pStart;
	sxi32 iNest = 0;
	if( pCur >= pEnd || (pCur->nType & JX9_TK_SEMI/*';'*/) ){
		/* Last expression */
		return SXERR_EOF;
	}
	while( pCur < pEnd ){
		if( (pCur->nType & (JX9_TK_COMMA/*','*/|JX9_TK_SEMI/*';'*/)) && iNest <= 0){
			break;
		}
		if( pCur->nType & (JX9_TK_LPAREN/*'('*/|JX9_TK_OSB/*'['*/|JX9_TK_OCB/*'{'*/) ){
			iNest++;
		}else if( pCur->nType & (JX9_TK_RPAREN/*')'*/|JX9_TK_CSB/*']'*/|JX9_TK_CCB/*'}*/) ){
			iNest--;
		}
		pCur++;
	}
	*ppNext = pCur;
	return SXRET_OK;
}